

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-htable.c
# Opt level: O0

void test_lookup(void)

{
  int iVar1;
  HTABLE_NODE *pHVar2;
  HTABLE_NODE *node;
  int i;
  char key [8];
  VAL val_key;
  HTABLE htable;
  HTABLE_NODE *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar3;
  HTABLE_NODE *in_stack_ffffffffffffffc8;
  HTABLE *in_stack_ffffffffffffffd0;
  _func_void_HTABLE_NODE_ptr *dtor_func;
  HTABLE *in_stack_ffffffffffffffe0;
  undefined1 local_18 [24];
  
  memset(local_18,0,0x18);
  for (uVar3 = 0; (int)uVar3 < 100000; uVar3 = uVar3 + 1) {
    snprintf(&stack0xffffffffffffffc8,8,"%d",(ulong)uVar3);
    make_val((char *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
             (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    iVar1 = htable_insert(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                          (HTABLE_CMP_FUNC)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
                          (HTABLE_HASH_FUNC)in_stack_ffffffffffffffb8);
    acutest_check_((int)(ulong)(iVar1 == 0),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-htable.c"
                   ,0x86,"%s","htable_insert(&htable, make_val(key, i), cmp_func, hash_func) == 0");
  }
  for (uVar3 = 0; (int)uVar3 < 100000; uVar3 = uVar3 + 1) {
    snprintf(&stack0xffffffffffffffc8,8,"%d",(ulong)uVar3);
    in_stack_ffffffffffffffb8 =
         htable_lookup(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                       (HTABLE_CMP_FUNC)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
                       (HTABLE_HASH_FUNC)in_stack_ffffffffffffffb8);
    acutest_check_((int)(ulong)(in_stack_ffffffffffffffb8 != (HTABLE_NODE *)0x0),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-htable.c"
                   ,0x90,"%s","node != NULL");
    acutest_check_((int)(ulong)(*(uint *)&in_stack_ffffffffffffffb8[2].next == uVar3),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-htable.c"
                   ,0x91,"%s","HTABLE_DATA(node, VAL, the_node)->payload == i");
  }
  dtor_func = (_func_void_HTABLE_NODE_ptr *)&stack0xffffffffffffffc8;
  snprintf((char *)dtor_func,8,"n/a");
  pHVar2 = htable_lookup(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                         (HTABLE_CMP_FUNC)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
                         (HTABLE_HASH_FUNC)in_stack_ffffffffffffffb8);
  acutest_check_((int)(ulong)(pHVar2 == (HTABLE_NODE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-htable.c"
                 ,0x96,"%s","htable_lookup(&htable, &val_key.the_node, cmp_func, hash_func) == NULL"
                );
  htable_fini(in_stack_ffffffffffffffe0,dtor_func);
  return;
}

Assistant:

static void
test_lookup(void)
{
    HTABLE htable = HTABLE_INITIALIZER;
    VAL val_key;
    char key[8];
    int i;

    for(i = 0; i < 100000; i++) {
        snprintf(key, 8, "%d", i);
        TEST_CHECK(htable_insert(&htable, make_val(key, i), cmp_func, hash_func) == 0);
    }

    for(i = 0; i < 100000; i++) {
        HTABLE_NODE* node;

        val_key.key = key;
        snprintf(val_key.key, 8, "%d", i);

        node = htable_lookup(&htable, &val_key.the_node, cmp_func, hash_func);
        TEST_CHECK(node != NULL);
        TEST_CHECK(HTABLE_DATA(node, VAL, the_node)->payload == i);
    }

    val_key.key = key;
    snprintf(val_key.key, 8, "n/a");
    TEST_CHECK(htable_lookup(&htable, &val_key.the_node, cmp_func, hash_func) == NULL);

    htable_fini(&htable, dtor_func);
}